

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

uint __thiscall Gluco::Solver::computeLBD(Solver *this,vec<Gluco::Lit> *lits,int end)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  Lit *pLVar4;
  uint *puVar5;
  int local_38;
  int l_1;
  int i_1;
  int l;
  uint local_24;
  int i;
  uint nbDone;
  int nblevels;
  int end_local;
  vec<Gluco::Lit> *lits_local;
  Solver *this_local;
  
  i = 0;
  this->MYFLAG = this->MYFLAG + 1;
  if (this->incremental == 0) {
    for (local_38 = 0; iVar3 = vec<Gluco::Lit>::size(lits), local_38 < iVar3;
        local_38 = local_38 + 1) {
      pLVar4 = vec<Gluco::Lit>::operator[](lits,local_38);
      iVar3 = Gluco::var((Lit)pLVar4->x);
      iVar3 = level(this,iVar3);
      puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar3);
      if (*puVar5 != this->MYFLAG) {
        uVar1 = this->MYFLAG;
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar3);
        *puVar5 = uVar1;
        i = i + 1;
      }
    }
  }
  else {
    nbDone = end;
    if (end == -1) {
      nbDone = vec<Gluco::Lit>::size(lits);
    }
    local_24 = 0;
    l = 0;
    while ((iVar3 = vec<Gluco::Lit>::size(lits), l < iVar3 && (local_24 < nbDone))) {
      pLVar4 = vec<Gluco::Lit>::operator[](lits,l);
      iVar3 = Gluco::var((Lit)pLVar4->x);
      bVar2 = isSelector(this,iVar3);
      if (!bVar2) {
        local_24 = local_24 + 1;
        pLVar4 = vec<Gluco::Lit>::operator[](lits,l);
        iVar3 = Gluco::var((Lit)pLVar4->x);
        iVar3 = level(this,iVar3);
        puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar3);
        if (*puVar5 != this->MYFLAG) {
          uVar1 = this->MYFLAG;
          puVar5 = vec<unsigned_int>::operator[](&this->permDiff,iVar3);
          *puVar5 = uVar1;
          i = i + 1;
        }
      }
      l = l + 1;
    }
  }
  return i;
}

Assistant:

inline unsigned int Solver::computeLBD(const vec<Lit> & lits,int end) {
  int nblevels = 0;
  MYFLAG++;

  if(incremental) { // ----------------- INCREMENTAL MODE
    if(end==-1) end = lits.size();
    unsigned int nbDone = 0;
    for(int i=0;i<lits.size();i++) {
      if(nbDone>=end) break;
      if(isSelector(var(lits[i]))) continue;
      nbDone++;
      int l = level(var(lits[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  } else { // -------- DEFAULT MODE. NOT A LOT OF DIFFERENCES... BUT EASIER TO READ
    for(int i=0;i<lits.size();i++) {
      int l = level(var(lits[i]));
      if (permDiff[l] != MYFLAG) {
        permDiff[l] = MYFLAG;
        nblevels++;
      }
    }
  }

  return nblevels;
}